

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunction * duckdb::EvenFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  FunctionNullHandling in_stack_ffffffffffffff58;
  allocator_type local_a1;
  code *bind_lambda;
  LogicalType local_80;
  vector<duckdb::LogicalType,_true> local_68;
  LogicalType local_50;
  LogicalType local_38;
  
  LogicalType::LogicalType(&local_38,DOUBLE);
  __l._M_len = 1;
  __l._M_array = &local_38;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68,__l,
             &local_a1);
  LogicalType::LogicalType(&local_80,DOUBLE);
  bind_lambda = ScalarFunction::UnaryFunction<double,double,duckdb::EvenOperator>;
  LogicalType::LogicalType(&local_50,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_50;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff44;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff4c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_68,&local_80,(scalar_function_t *)&stack0xffffffffffffff60,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff58,bind_lambda);
  LogicalType::~LogicalType(&local_50);
  ::std::
  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  ::_M_manager((_Any_data *)&stack0xffffffffffffff60,(_Any_data *)&stack0xffffffffffffff60,
               __destroy_functor);
  LogicalType::~LogicalType(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  LogicalType::~LogicalType(&local_38);
  return in_RDI;
}

Assistant:

ScalarFunction EvenFun::GetFunction() {
	return ScalarFunction({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                      ScalarFunction::UnaryFunction<double, double, EvenOperator>);
}